

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

size_t png_setup_sub_row(png_structrp png_ptr,png_uint_32 bpp,size_t row_bytes,size_t lmins)

{
  byte bVar1;
  png_byte pVar2;
  char cVar3;
  uint local_5c;
  uint local_58;
  ulong uStack_50;
  uint v;
  size_t sum;
  size_t i;
  png_bytep lp;
  png_bytep dp;
  png_bytep rp;
  size_t lmins_local;
  size_t row_bytes_local;
  png_uint_32 bpp_local;
  png_structrp png_ptr_local;
  
  uStack_50 = 0;
  *png_ptr->try_row = '\x01';
  sum = 0;
  dp = png_ptr->row_buf;
  lp = png_ptr->try_row;
  while( true ) {
    dp = dp + 1;
    lp = lp + 1;
    if (bpp <= sum) break;
    bVar1 = *dp;
    *lp = bVar1;
    local_58 = (uint)bVar1;
    if (0x7f < local_58) {
      local_58 = 0x100 - local_58;
    }
    uStack_50 = local_58 + uStack_50;
    sum = sum + 1;
  }
  i = (size_t)png_ptr->row_buf;
  while( true ) {
    i = i + 1;
    if (row_bytes <= sum) {
      return uStack_50;
    }
    pVar2 = *dp;
    cVar3 = *(char *)i;
    *lp = pVar2 - cVar3;
    local_5c = (uint)(byte)(pVar2 - cVar3);
    if (0x7f < local_5c) {
      local_5c = 0x100 - local_5c;
    }
    uStack_50 = local_5c + uStack_50;
    if (lmins < uStack_50) break;
    sum = sum + 1;
    dp = dp + 1;
    lp = lp + 1;
  }
  return uStack_50;
}

Assistant:

static size_t /* PRIVATE */
png_setup_sub_row(png_structrp png_ptr, png_uint_32 bpp,
    size_t row_bytes, size_t lmins)
{
   png_bytep rp, dp, lp;
   size_t i;
   size_t sum = 0;
   unsigned int v;

   png_ptr->try_row[0] = PNG_FILTER_VALUE_SUB;

   for (i = 0, rp = png_ptr->row_buf + 1, dp = png_ptr->try_row + 1; i < bpp;
        i++, rp++, dp++)
   {
      v = *dp = *rp;
#ifdef PNG_USE_ABS
      sum += 128 - abs((int)v - 128);
#else
      sum += (v < 128) ? v : 256 - v;
#endif
   }

   for (lp = png_ptr->row_buf + 1; i < row_bytes;
      i++, rp++, lp++, dp++)
   {
      v = *dp = (png_byte)(((int)*rp - (int)*lp) & 0xff);
#ifdef PNG_USE_ABS
      sum += 128 - abs((int)v - 128);
#else
      sum += (v < 128) ? v : 256 - v;
#endif

      if (sum > lmins)  /* We are already worse, don't continue. */
        break;
   }

   return sum;
}